

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O0

int __thiscall YAML::RegEx::MatchOpAnd<YAML::StreamCharSource>(RegEx *this,StreamCharSource *source)

{
  int iVar1;
  StreamCharSource *pSVar2;
  RegEx *in_RDI;
  int n;
  size_t i;
  int first;
  StreamCharSource *source_00;
  StreamCharSource *local_28;
  int local_1c;
  
  local_1c = -1;
  local_28 = (StreamCharSource *)0x0;
  while( true ) {
    source_00 = local_28;
    pSVar2 = (StreamCharSource *)
             std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::size(&in_RDI->m_params);
    if (pSVar2 <= source_00) {
      return local_1c;
    }
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::operator[]
              (&in_RDI->m_params,(size_type)local_28);
    iVar1 = MatchUnchecked<YAML::StreamCharSource>(in_RDI,source_00);
    if (iVar1 == -1) break;
    if (local_28 == (StreamCharSource *)0x0) {
      local_1c = iVar1;
    }
    local_28 = (StreamCharSource *)((long)&local_28->m_offset + 1);
  }
  return -1;
}

Assistant:

inline int RegEx::MatchOpAnd(const Source& source) const {
  int first = -1;
  for (std::size_t i = 0; i < m_params.size(); i++) {
    int n = m_params[i].MatchUnchecked(source);
    if (n == -1)
      return -1;
    if (i == 0)
      first = n;
  }
  return first;
}